

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spanning_tree.cc
# Opt level: O0

int socket_sort(void *s1,void *s2)

{
  client *socket2;
  client *socket1;
  void *s2_local;
  void *s1_local;
  undefined4 local_4;
  
  if (*s1 == *s2) {
    local_4 = *(int *)((long)s1 + 4) - *(int *)((long)s2 + 4);
  }
  else {
    local_4 = *s1 - *s2;
  }
  return local_4;
}

Assistant:

static int socket_sort(const void* s1, const void* s2)
{
  client* socket1 = (client*)s1;
  client* socket2 = (client*)s2;
  if (socket1->client_ip != socket2->client_ip)
    return socket1->client_ip - socket2->client_ip;
  else
    return (int)(socket1->socket - socket2->socket);
}